

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O3

bool __thiscall lzham::search_accelerator::find_all_matches(search_accelerator *this,uint num_bytes)

{
  byte bVar1;
  uchar *puVar2;
  uchar *puVar3;
  bool bVar4;
  uint uVar5;
  void *pData_ptr;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  uVar7 = this->m_max_probes * num_bytes;
  if (((this->m_matches).m_capacity < uVar7) &&
     (bVar4 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_matches,uVar7,
                         (this->m_matches).m_size + 1 == uVar7,5,(object_mover)0x0,true), !bVar4)) {
    return false;
  }
  (this->m_matches).m_size = uVar7;
  if (((this->m_match_refs).m_capacity < num_bytes) &&
     (bVar4 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_match_refs,num_bytes,
                         (this->m_match_refs).m_size + 1 == num_bytes,8,(object_mover)0x0,true),
     !bVar4)) {
    return false;
  }
  (this->m_match_refs).m_size = num_bytes;
  memset((this->m_match_refs).m_p,0xff,(ulong)(num_bytes * 8));
  this->m_fill_lookahead_pos = this->m_lookahead_pos;
  this->m_fill_lookahead_size = num_bytes;
  this->m_fill_dict_size = this->m_cur_dict_size;
  this->m_next_match_ref = 0;
  if (this->m_pTask_pool == (task_pool *)0x0) {
    find_all_matches_callback(this,0,pData_ptr);
    this->m_num_completed_helper_threads = 0;
  }
  else {
    if (((this->m_hash_thread_index).m_capacity < 0x10000) &&
       (bVar4 = elemental_vector::increase_capacity
                          ((elemental_vector *)&this->m_hash_thread_index,0x10000,
                           (this->m_hash_thread_index).m_size == 0xffff,1,(object_mover)0x0,true),
       !bVar4)) {
      return false;
    }
    (this->m_hash_thread_index).m_size = 0x10000;
    memset((this->m_hash_thread_index).m_p,0xff,0x10000);
    if (2 < (int)num_bytes) {
      uVar6 = (ulong)(this->m_max_dict_size_mask & this->m_lookahead_pos);
      puVar2 = (this->m_dict).m_p;
      lVar8 = 2;
      uVar9 = 0;
      uVar7 = (uint)puVar2[uVar6];
      uVar5 = (uint)puVar2[uVar6 + 1];
      do {
        bVar1 = puVar2[lVar8 + uVar6];
        uVar7 = (uint)bVar1 << 4 ^ (uVar5 << 8 | uVar7);
        puVar3 = (this->m_hash_thread_index).m_p;
        if (puVar3[uVar7] == 0xff) {
          puVar3[uVar7] = (uchar)uVar9;
          uVar9 = uVar9 + 1;
          if (uVar9 == this->m_max_helper_threads) {
            uVar9 = 0;
          }
        }
        lVar8 = lVar8 + 1;
        uVar7 = uVar5;
        uVar5 = (uint)bVar1;
      } while (num_bytes != (uint)lVar8);
    }
    this->m_num_completed_helper_threads = 0;
    bVar4 = task_pool::
            queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
                      (this->m_pTask_pool,this,0x10f928,0,0,
                       (void *)(ulong)this->m_max_helper_threads);
    if (!bVar4) {
      return false;
    }
  }
  bVar4 = find_len2_matches(this);
  return bVar4;
}

Assistant:

bool search_accelerator::find_all_matches(uint num_bytes)
   {
      if (!m_matches.try_resize_no_construct(m_max_probes * num_bytes))
         return false;

      if (!m_match_refs.try_resize_no_construct(num_bytes))
         return false;

      memset(m_match_refs.get_ptr(), 0xFF, m_match_refs.size_in_bytes());

      m_fill_lookahead_pos = m_lookahead_pos;
      m_fill_lookahead_size = num_bytes;
      m_fill_dict_size = m_cur_dict_size;

      m_next_match_ref = 0;

      if (!m_pTask_pool)
      {
         find_all_matches_callback(0, NULL);
         
         m_num_completed_helper_threads = 0;
      }
      else
      {
         if (!m_hash_thread_index.try_resize_no_construct(0x10000))
            return false;

         memset(m_hash_thread_index.get_ptr(), 0xFF, m_hash_thread_index.size_in_bytes());

         uint next_thread_index = 0;
         const uint8* pDict = &m_dict[m_lookahead_pos & m_max_dict_size_mask];
         uint num_unique_digrams = 0;

         if (num_bytes >= 3)
         {
            uint c0 = pDict[0];
            uint c1 = pDict[1];

            const int limit = ((int)num_bytes - 2);
            for (int i = 0; i < limit; i++)
            {
               uint c2 = pDict[2];
               uint t = hash3_to_16(c0, c1, c2);
               c0 = c1;
               c1 = c2;

               pDict++;

               if (m_hash_thread_index[t] == UINT8_MAX)
               {
                  num_unique_digrams++;

                  m_hash_thread_index[t] = static_cast<uint8>(next_thread_index);
                  if (++next_thread_index == m_max_helper_threads)
                        next_thread_index = 0;
               }
            }
         }
         
         m_num_completed_helper_threads = 0;

         if (!m_pTask_pool->queue_multiple_object_tasks(this, &search_accelerator::find_all_matches_callback, 0, m_max_helper_threads))
            return false;
      }

      return find_len2_matches();
   }